

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsParallel.h
# Opt level: O1

void highs::parallel::for_each<HEkkDual::majorChooseRowBtran()::__0&>
               (HighsInt start,HighsInt end,anon_class_40_5_3855c632 *f,HighsInt grainSize)

{
  uint32_t *puVar1;
  __atomic_base<int> _Var2;
  uint uVar3;
  uint32_t uVar4;
  element_type *peVar5;
  HEkkDual *pHVar6;
  HVectorBase<double> *pHVar7;
  HighsSplitDeque *pHVar8;
  long *plVar9;
  ulong uVar10;
  HighsTimerClock *pHVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  double dVar15;
  TaskGroup tg;
  TaskGroup local_40;
  
  iVar13 = end - start;
  if (grainSize < iVar13) {
    HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
    plVar9 = (long *)__tls_get_addr(&PTR_00449ef0);
    local_40.workerDeque = (HighsSplitDeque *)*plVar9;
    local_40.dequeHead = ((local_40.workerDeque)->ownerData).head;
    do {
      pHVar8 = local_40.workerDeque;
      iVar13 = start + end >> 1;
      uVar3 = ((local_40.workerDeque)->ownerData).head;
      uVar10 = (ulong)uVar3;
      if (uVar10 < 0x2000) {
        ((local_40.workerDeque)->ownerData).head = uVar3 + 1;
        ((local_40.workerDeque)->taskArray)._M_elems[uVar10].metadata.stealer.
        super___atomic_base<unsigned_long>._M_i = 0;
        *(undefined ***)((local_40.workerDeque)->taskArray)._M_elems[uVar10].taskData =
             &PTR_operator___004493a0;
        *(int *)(((local_40.workerDeque)->taskArray)._M_elems[uVar10].taskData + 8) = iVar13;
        *(HighsInt *)(((local_40.workerDeque)->taskArray)._M_elems[uVar10].taskData + 0xc) = end;
        *(HighsInt *)(((local_40.workerDeque)->taskArray)._M_elems[uVar10].taskData + 0x10) =
             grainSize;
        *(anon_class_40_5_3855c632 **)
         (((local_40.workerDeque)->taskArray)._M_elems[uVar10].taskData + 0x18) = f;
        if (((local_40.workerDeque)->ownerData).allStolenCopy == true) {
          uVar4 = ((local_40.workerDeque)->ownerData).head;
          ((local_40.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
               CONCAT44(uVar4 - 1,uVar4);
          ((local_40.workerDeque)->stealerData).allStolen._M_base._M_i = false;
          ((local_40.workerDeque)->ownerData).splitCopy = ((local_40.workerDeque)->ownerData).head;
          ((local_40.workerDeque)->ownerData).allStolenCopy = false;
          if ((((local_40.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
            ((local_40.workerDeque)->splitRequest)._M_base._M_i = false;
          }
          peVar5 = ((local_40.workerDeque)->ownerData).workerBunk.
                   super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          LOCK();
          _Var2._M_i = (peVar5->haveJobs).super___atomic_base<int>._M_i;
          (peVar5->haveJobs).super___atomic_base<int>._M_i =
               (peVar5->haveJobs).super___atomic_base<int>._M_i + 1;
          UNLOCK();
          if (_Var2._M_i < ((local_40.workerDeque)->ownerData).numWorkers + -1) {
            HighsSplitDeque::WorkerBunk::publishWork
                      (((local_40.workerDeque)->ownerData).workerBunk.
                       super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,local_40.workerDeque);
          }
        }
        else {
          HighsSplitDeque::growShared(local_40.workerDeque);
        }
      }
      else {
        if ((((local_40.workerDeque)->ownerData).splitCopy < 0x2000) &&
           (((local_40.workerDeque)->ownerData).allStolenCopy == false)) {
          HighsSplitDeque::growShared(local_40.workerDeque);
        }
        puVar1 = &(pHVar8->ownerData).head;
        *puVar1 = *puVar1 + 1;
        for_each<HEkkDual::majorChooseRowBtran()::__0&>(iVar13,end,f,grainSize);
      }
      end = iVar13;
    } while (grainSize < iVar13 - start);
    iVar12 = iVar13 - start;
    if (iVar12 != 0 && start <= iVar13) {
      pHVar6 = f->this;
      lVar14 = (long)start;
      do {
        iVar13 = (*f->multi_iRow)[lVar14];
        pHVar7 = (*f->multi_vector)[lVar14];
        HVectorBase<double>::clear(pHVar7);
        pHVar7->count = 1;
        *(pHVar7->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start = iVar13;
        (pHVar7->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar13] = 1.0;
        pHVar7->packFlag = true;
        pHVar11 = HighsSimplexAnalysis::getThreadFactorTimerClockPointer(pHVar6->analysis);
        HSimplexNla::btran(&pHVar6->ekk_instance_->simplex_nla_,pHVar7,
                           (pHVar6->ekk_instance_->info_).row_ep_density,pHVar11);
        if (pHVar6->edge_weight_mode == kSteepestEdge) {
          dVar15 = HVectorBase<double>::norm2(pHVar7);
        }
        else {
          dVar15 = (f->edge_weight->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[iVar13];
        }
        (*f->multi_EdWt)[lVar14] = dVar15;
        lVar14 = lVar14 + 1;
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    TaskGroup::taskWait(&local_40);
    TaskGroup::~TaskGroup(&local_40);
  }
  else if (start < end) {
    pHVar6 = f->this;
    lVar14 = (long)start;
    do {
      iVar12 = (*f->multi_iRow)[lVar14];
      pHVar7 = (*f->multi_vector)[lVar14];
      HVectorBase<double>::clear(pHVar7);
      pHVar7->count = 1;
      *(pHVar7->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start = iVar12;
      (pHVar7->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar12] = 1.0;
      pHVar7->packFlag = true;
      pHVar11 = HighsSimplexAnalysis::getThreadFactorTimerClockPointer(pHVar6->analysis);
      HSimplexNla::btran(&pHVar6->ekk_instance_->simplex_nla_,pHVar7,
                         (pHVar6->ekk_instance_->info_).row_ep_density,pHVar11);
      if (pHVar6->edge_weight_mode == kSteepestEdge) {
        dVar15 = HVectorBase<double>::norm2(pHVar7);
      }
      else {
        dVar15 = (f->edge_weight->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar12];
      }
      (*f->multi_EdWt)[lVar14] = dVar15;
      lVar14 = lVar14 + 1;
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
  }
  return;
}

Assistant:

void for_each(HighsInt start, HighsInt end, F&& f, HighsInt grainSize = 1) {
  if (end - start <= grainSize) {
    f(start, end);
  } else {
    TaskGroup tg;

    do {
      HighsInt split = (start + end) >> 1;
      tg.spawn([split, end, grainSize, &f]() {
        for_each(split, end, f, grainSize);
      });
      end = split;
    } while (end - start > grainSize);

    f(start, end);
    tg.taskWait();
  }
}